

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raft_server_req_handlers.cxx
# Opt level: O3

ptr<resp_msg> __thiscall cornerstone::raft_server::handle_rm_srv_req(raft_server *this,req_msg *req)

{
  int32 *__rwlock;
  ulong uVar1;
  undefined4 uVar2;
  element_type *peVar3;
  buffer *pbVar4;
  long *plVar5;
  _func_int **pp_Var6;
  undefined8 *puVar7;
  size_t sVar8;
  iterator iVar9;
  long lVar10;
  size_t sVar11;
  runtime_error *prVar12;
  long in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var13;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_03;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_04;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_05;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_06;
  ptr<resp_msg> pVar14;
  undefined1 auVar15 [16];
  int32 srv_id;
  ptr<req_msg> leave_req;
  uint local_d4;
  peer *local_d0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_c8;
  ptr<req_msg> local_c0;
  element_type local_b0;
  char *local_58;
  long *local_50 [2];
  long local_40 [2];
  
  peVar3 = ((req[3].log_entries_.
             super__Vector_base<std::shared_ptr<cornerstone::log_entry>,_std::allocator<std::shared_ptr<cornerstone::log_entry>_>_>
             ._M_impl.super__Vector_impl_data._M_finish)->
           super___shared_ptr<cornerstone::log_entry,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  puVar7 = (undefined8 *)operator_new(0x40);
  puVar7[1] = 0x100000001;
  *puVar7 = &PTR___Sp_counted_ptr_inplace_00178730;
  puVar7[3] = peVar3;
  *(undefined4 *)(puVar7 + 4) = 9;
  uVar1 = (req->super_msg_base).term_;
  *(ulong *)((long)puVar7 + 0x24) = CONCAT44((int)uVar1,(int)(uVar1 >> 0x20));
  puVar7[2] = &PTR__msg_base_00178780;
  puVar7[6] = 0;
  *(undefined1 *)(puVar7 + 7) = 0;
  *(undefined8 **)&this->leader_ = puVar7;
  this->_vptr_raft_server = (_func_int **)(puVar7 + 2);
  if (*(long *)(in_RDX + 0x40) - (long)*(long **)(in_RDX + 0x38) == 0x10) {
    pbVar4 = *(buffer **)(**(long **)(in_RDX + 0x38) + 0x18);
    if (pbVar4 == (buffer *)0x0) {
      prVar12 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error
                (prVar12,"get_buf cannot be called for a log_entry with nil buffer");
      __cxa_throw(prVar12,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    sVar8 = buffer::size(pbVar4);
    if (sVar8 != 4) goto LAB_0014d7bc;
    if (*(int *)&req[3].log_entries_.
                 super__Vector_base<std::shared_ptr<cornerstone::log_entry>,_std::allocator<std::shared_ptr<cornerstone::log_entry>_>_>
                 ._M_impl.super__Vector_impl_data._M_start == 3) {
      if (*(char *)((long)&req->last_log_idx_ + 1) == '\x01') {
        plVar5 = (long *)req[4].last_log_term_;
        local_c0.super___shared_ptr<cornerstone::req_msg,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             &local_b0;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_c0,"previous config has not committed yet","");
        (**(code **)(*plVar5 + 0x18))(plVar5,&local_c0);
        _Var13._M_pi = extraout_RDX;
      }
      else {
        pbVar4 = *(buffer **)(**(long **)(in_RDX + 0x38) + 0x18);
        if (pbVar4 == (buffer *)0x0) {
          prVar12 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error
                    (prVar12,"get_buf cannot be called for a log_entry with nil buffer");
          __cxa_throw(prVar12,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        local_d4 = buffer::get_int(pbVar4);
        if (local_d4 != *(uint *)((long)&(req->super_msg_base).term_ + 4)) {
          local_c8._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          __rwlock = &req[2].super_msg_base.dst_;
          std::__shared_mutex_pthread::lock_shared((__shared_mutex_pthread *)__rwlock);
          iVar9 = std::
                  _Hashtable<int,_std::pair<const_int,_std::shared_ptr<cornerstone::peer>_>,_std::allocator<std::pair<const_int,_std::shared_ptr<cornerstone::peer>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                  ::find((_Hashtable<int,_std::pair<const_int,_std::shared_ptr<cornerstone::peer>_>,_std::allocator<std::pair<const_int,_std::shared_ptr<cornerstone::peer>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                          *)&req[1].commit_idx_,(key_type_conflict *)&local_d4);
          if (iVar9.
              super__Node_iterator_base<std::pair<const_int,_std::shared_ptr<cornerstone::peer>_>,_false>
              ._M_cur == (__node_type *)0x0) {
            plVar5 = (long *)req[4].last_log_term_;
            local_58 = "server %d does not exist";
            snprintf((char *)&local_c0,100,"server %d does not exist",(ulong)local_d4);
            local_50[0] = local_40;
            sVar11 = strlen((char *)&local_c0);
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_50,&local_c0,
                       (long)&local_c0.
                              super___shared_ptr<cornerstone::req_msg,_(__gnu_cxx::_Lock_policy)2>.
                              _M_ptr + sVar11);
            (**(code **)(*plVar5 + 0x18))(plVar5,local_50);
            if (local_50[0] != local_40) {
              operator_delete(local_50[0],local_40[0] + 1);
            }
            pthread_rwlock_unlock((pthread_rwlock_t *)__rwlock);
            _Var13._M_pi = extraout_RDX_06;
          }
          else {
            local_d0 = *(peer **)((long)iVar9.
                                        super__Node_iterator_base<std::pair<const_int,_std::shared_ptr<cornerstone::peer>_>,_false>
                                        ._M_cur + 0x10);
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                      (&local_c8,
                       (__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                       ((long)iVar9.
                              super__Node_iterator_base<std::pair<const_int,_std::shared_ptr<cornerstone::peer>_>,_false>
                              ._M_cur + 0x18));
            pthread_rwlock_unlock((pthread_rwlock_t *)__rwlock);
            peVar3 = ((req[3].log_entries_.
                       super__Vector_base<std::shared_ptr<cornerstone::log_entry>,_std::allocator<std::shared_ptr<cornerstone::log_entry>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish)->
                     super___shared_ptr<cornerstone::log_entry,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
            lVar10 = (**(code **)(*req[4].super_msg_base._vptr_msg_base + 0x10))();
            local_c0.super___shared_ptr<cornerstone::req_msg,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x60);
            (local_c0.super___shared_ptr<cornerstone::req_msg,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi)->_M_use_count = 1;
            (local_c0.super___shared_ptr<cornerstone::req_msg,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi)->_M_weak_count = 1;
            (local_c0.super___shared_ptr<cornerstone::req_msg,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi)->_vptr__Sp_counted_base =
                 (_func_int **)&PTR___Sp_counted_ptr_inplace_00176788;
            local_c0.super___shared_ptr<cornerstone::req_msg,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 (element_type *)
                 (local_c0.super___shared_ptr<cornerstone::req_msg,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi + 1);
            uVar2 = *(undefined4 *)((long)&(req->super_msg_base).term_ + 4);
            pp_Var6 = *(_func_int ***)&(req->super_msg_base).dst_;
            *(element_type **)
             &local_c0.super___shared_ptr<cornerstone::req_msg,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi[1]._M_use_count = peVar3;
            *(undefined4 *)
             &local_c0.super___shared_ptr<cornerstone::req_msg,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi[2]._vptr__Sp_counted_base = 0xe;
            *(undefined4 *)
             ((long)&local_c0.super___shared_ptr<cornerstone::req_msg,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi[2]._vptr__Sp_counted_base + 4) = uVar2;
            local_c0.super___shared_ptr<cornerstone::req_msg,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi[2]._M_use_count = local_d4;
            local_c0.super___shared_ptr<cornerstone::req_msg,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi[1]._vptr__Sp_counted_base = (_func_int **)&PTR__req_msg_001767d8;
            local_c0.super___shared_ptr<cornerstone::req_msg,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi[3]._vptr__Sp_counted_base = (_func_int **)0x0;
            *(long *)&local_c0.super___shared_ptr<cornerstone::req_msg,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi[3]._M_use_count = lVar10 + -1;
            local_c0.super___shared_ptr<cornerstone::req_msg,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi[4]._vptr__Sp_counted_base = pp_Var6;
            *(undefined1 (*) [16])
             &local_c0.super___shared_ptr<cornerstone::req_msg,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi[4]._M_use_count = (undefined1  [16])0x0;
            local_c0.super___shared_ptr<cornerstone::req_msg,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi[5]._M_use_count = 0;
            local_c0.super___shared_ptr<cornerstone::req_msg,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi[5]._M_weak_count = 0;
            peer::send_req(local_d0,&local_c0,(rpc_handler *)&req[9].super_msg_base.type_);
            auVar15 = (**(code **)(*req[4].super_msg_base._vptr_msg_base + 0x10))();
            _Var13._M_pi = auVar15._8_8_;
            puVar7[6] = auVar15._0_8_;
            *(undefined1 *)(puVar7 + 7) = 1;
            if (local_c0.super___shared_ptr<cornerstone::req_msg,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        (local_c0.
                         super___shared_ptr<cornerstone::req_msg,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi);
              _Var13._M_pi = extraout_RDX_04;
            }
            if (local_c8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_c8._M_pi);
              _Var13._M_pi = extraout_RDX_05;
            }
          }
          goto LAB_0014d80a;
        }
        plVar5 = (long *)req[4].last_log_term_;
        local_c0.super___shared_ptr<cornerstone::req_msg,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             &local_b0;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_c0,"cannot request to remove leader","");
        (**(code **)(*plVar5 + 0x18))(plVar5,&local_c0);
        _Var13._M_pi = extraout_RDX_03;
      }
    }
    else {
      plVar5 = (long *)req[4].last_log_term_;
      local_c0.super___shared_ptr<cornerstone::req_msg,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           &local_b0;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_c0,"this is not a leader, cannot handle RemoveServerRequest","");
      (**(code **)(*plVar5 + 0x18))(plVar5,&local_c0);
      _Var13._M_pi = extraout_RDX_02;
    }
  }
  else {
LAB_0014d7bc:
    plVar5 = (long *)req[4].last_log_term_;
    local_c0.super___shared_ptr<cornerstone::req_msg,_(__gnu_cxx::_Lock_policy)2>._M_ptr = &local_b0
    ;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_c0,
               "bad remove server request as we are expecting one log entry with value type of int",
               "");
    (**(code **)(*plVar5 + 0x18))(plVar5,&local_c0);
    _Var13._M_pi = extraout_RDX_00;
  }
  if (local_c0.super___shared_ptr<cornerstone::req_msg,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      &local_b0) {
    operator_delete(local_c0.super___shared_ptr<cornerstone::req_msg,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr,(long)local_b0.super_msg_base._vptr_msg_base + 1);
    _Var13._M_pi = extraout_RDX_01;
  }
LAB_0014d80a:
  pVar14.super___shared_ptr<cornerstone::resp_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var13._M_pi;
  pVar14.super___shared_ptr<cornerstone::resp_msg,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (ptr<resp_msg>)pVar14.super___shared_ptr<cornerstone::resp_msg,_(__gnu_cxx::_Lock_policy)2>
  ;
}

Assistant:

ptr<resp_msg> raft_server::handle_rm_srv_req(req_msg& req)
{
    std::vector<ptr<log_entry>>& entries(req.log_entries());
    ptr<resp_msg> resp(cs_new<resp_msg>(state_->get_term(), msg_type::remove_server_response, id_, leader_));
    if (entries.size() != 1 || entries[0]->get_buf().size() != sz_int)
    {
        l_->info("bad remove server request as we are expecting one log entry with value type of int");
        return resp;
    }

    if (role_ != srv_role::leader)
    {
        l_->info("this is not a leader, cannot handle RemoveServerRequest");
        return resp;
    }

    if (config_changing_)
    {
        // the previous config has not committed yet
        l_->info("previous config has not committed yet");
        return resp;
    }

    int32 srv_id = entries[0]->get_buf().get_int();
    if (srv_id == id_)
    {
        l_->info("cannot request to remove leader");
        return resp;
    }

    ptr<peer> p;
    {
        read_lock(peers_lock_);
        peer_itor pit = peers_.find(srv_id);
        if (pit == peers_.end())
        {
            l_->info(sstrfmt("server %d does not exist").fmt(srv_id));
            return resp;
        }

        p = pit->second;
    }

    ptr<req_msg> leave_req(cs_new<req_msg>(
        state_->get_term(),
        msg_type::leave_cluster_request,
        id_,
        srv_id,
        0,
        log_store_->next_slot() - 1,
        quick_commit_idx_));
    p->send_req(leave_req, ex_resp_handler_);
    resp->accept(log_store_->next_slot());
    return resp;
}